

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall
spatial_region::f_init_focused
          (spatial_region *this,double a0y,double a0z,double xsigma,double sigma0,double x0,
          double x1,bool b_sign,double phase,double y0,double z0,bool append,double phi,int sscos,
          double K,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  int iVar123;
  int iVar124;
  celle *pcVar125;
  cellb *pcVar126;
  double dVar127;
  double dVar128;
  undefined1 auVar129 [16];
  double dVar130;
  undefined1 auVar131 [16];
  undefined8 uVar132;
  double dVar133;
  bool bVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  uint uVar171;
  long lVar172;
  long lVar173;
  long lVar174;
  long lVar175;
  double dVar176;
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  double dVar182;
  undefined1 auVar205 [16];
  double dVar183;
  undefined1 auVar206 [16];
  double dVar184;
  double dVar185;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar186;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar212 [16];
  double dVar187;
  double __x;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  ulong uVar316;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  undefined1 auVar216 [16];
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  double dVar201;
  double dVar202;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  double dVar203;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  double dVar204;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar313 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar314 [64];
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined1 auVar315 [64];
  double dVar317;
  undefined8 in_XMM1_Qb;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  double dVar376;
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  double dVar419;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  ulong in_XMM4_Qb;
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar439 [64];
  double dVar440;
  undefined1 auVar441 [16];
  undefined8 in_XMM7_Qb;
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined8 in_XMM14_Qb;
  undefined1 local_378 [16];
  undefined1 local_348 [16];
  double local_330;
  undefined1 local_2b8 [16];
  ulong local_2a8;
  double local_298;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  ulong local_258;
  double local_208;
  double local_1f8;
  ulong local_1d8;
  undefined1 local_188 [16];
  double local_88;
  double dStack_80;
  undefined1 auVar178 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar439._8_56_ = in_register_00001348;
  auVar439._0_8_ = x1;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = z0;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = y0 * y0;
  auVar442 = vfmadd213sd_fma(auVar439._0_16_,auVar439._0_16_,auVar442);
  auVar442 = vfmadd231sd_fma(auVar442,auVar178,auVar178);
  if (auVar442._0_8_ < 0.0) {
    auVar313._0_8_ = sqrt(auVar442._0_8_);
    auVar313._8_56_ = extraout_var;
    auVar442 = auVar313._0_16_;
  }
  else {
    auVar442 = vsqrtsd_avx(auVar442,auVar442);
  }
  uVar132 = vcmpsd_avx512f(auVar442,ZEXT816(0) << 0x40,0);
  bVar134 = (bool)((byte)uVar132 & 1);
  dVar133 = (double)((ulong)bVar134 * (long)this->dx + (ulong)!bVar134 * auVar442._0_8_);
  dVar127 = sigma0 * K * sigma0 * 0.5;
  dVar184 = dVar133 * dVar133;
  dVar182 = (dVar184 / dVar127) / dVar127 + 1.0;
  if (dVar182 < 0.0) {
    dVar182 = sqrt(dVar182);
  }
  else {
    auVar177._8_8_ = 0;
    auVar177._0_8_ = dVar182;
    auVar442 = vsqrtsd_avx(auVar177,auVar177);
    dVar182 = auVar442._0_8_;
  }
  dVar183 = dVar184 / (sigma0 * sigma0 * sigma0 * sigma0 * 0.25) + 1.0;
  if (dVar183 < 0.0) {
    dVar183 = sqrt(dVar183);
  }
  else {
    auVar205._8_8_ = 0;
    auVar205._0_8_ = dVar183;
    auVar442 = vsqrtsd_avx(auVar205,auVar205);
    dVar183 = auVar442._0_8_;
  }
  dVar128 = dVar127 * dVar127;
  dVar184 = dVar184 / dVar128 + 1.0;
  if (dVar184 < 0.0) {
    dVar184 = sqrt(dVar184);
  }
  else {
    auVar206._8_8_ = 0;
    auVar206._0_8_ = dVar184;
    auVar442 = vsqrtsd_avx(auVar206,auVar206);
    dVar184 = auVar442._0_8_;
  }
  auVar433._8_8_ = 0;
  auVar433._0_8_ = y0 * y0;
  iVar123 = this->ny;
  dVar4 = this->dy;
  iVar124 = this->nz;
  dVar5 = this->dz;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar133;
  auVar178 = vfmsub231sd_fma(auVar433,auVar131,auVar131);
  auVar129._8_8_ = in_XMM7_Qb;
  auVar129._0_8_ = y0;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = z0;
  auVar442 = vunpcklpd_avx(auVar129,auVar446);
  auVar135._8_8_ = 0x8000000000000000;
  auVar135._0_8_ = 0x8000000000000000;
  auVar177 = vxorpd_avx512vl(auVar442,auVar135);
  auVar442 = vshufps_avx(auVar177,auVar177,0x4e);
  auVar442 = vfmadd213sd_fma(auVar442,auVar446,auVar178);
  if (auVar442._0_8_ < 0.0) {
    dVar185 = sqrt(auVar442._0_8_);
  }
  else {
    auVar442 = vsqrtsd_avx(auVar442,auVar442);
    dVar185 = auVar442._0_8_;
  }
  auVar441._0_8_ = (dVar185 * (double)(int)-(((0.0 < x1) - 1) + (uint)(0.0 < x1))) / dVar133;
  auVar441._8_8_ = 0;
  auVar207._8_8_ = dVar133;
  auVar207._0_8_ = dVar133;
  auVar442 = vdivpd_avx(auVar177,auVar207);
  dVar185 = auVar442._0_8_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar185 * dVar185;
  auVar178 = vfmadd231sd_fma(auVar208,auVar441,auVar441);
  if (auVar178._0_8_ < 0.0) {
    dVar186 = sqrt(auVar178._0_8_);
  }
  else {
    auVar178 = vsqrtsd_avx(auVar178,auVar178);
    dVar186 = auVar178._0_8_;
  }
  uVar171 = 0;
  auVar318._0_8_ = -dVar185;
  auVar318._8_8_ = auVar442._8_8_ ^ 0x8000000000000000;
  auVar178 = vunpcklpd_avx(auVar318,auVar441);
  auVar209._8_8_ = dVar186;
  auVar209._0_8_ = dVar186;
  if (dVar186 != 0.0) {
    uVar171 = 0xff;
  }
  if (NAN(dVar186)) {
    uVar171 = 0xff;
  }
  auVar177 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar178 = vdivpd_avx512vl(auVar178,auVar209);
  bVar134 = (bool)((byte)uVar171 & 1);
  auVar179._0_8_ = (double)((ulong)bVar134 * auVar178._0_8_ | (ulong)!bVar134 * auVar177._0_8_);
  bVar134 = (bool)((byte)(uVar171 >> 1) & 1);
  auVar179._8_8_ = (double)((ulong)bVar134 * auVar178._8_8_ | (ulong)!bVar134 * auVar177._8_8_);
  auVar178 = vshufpd_avx(auVar442,auVar442,1);
  auVar177 = vshufpd_avx(auVar179,auVar441,1);
  auVar210._0_8_ = auVar177._0_8_ * -auVar178._0_8_;
  auVar210._8_8_ = auVar177._8_8_ * -0.0;
  auVar205 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar179);
  auVar206 = vfmadd213pd_fma(auVar205,auVar442,auVar210);
  auVar205 = vshufpd_avx(auVar179,auVar179,1);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = auVar179._0_8_ * dVar185;
  auVar205 = vfmsub213sd_fma(auVar205,auVar441,auVar211);
  if ((phi != 0.0) || (NAN(phi))) {
    local_348._0_8_ = cos(phi);
    local_348._8_8_ = extraout_XMM0_Qb;
    dVar186 = sin(phi);
    auVar319._8_8_ = 0;
    auVar319._0_8_ = auVar205._0_8_ * dVar186;
    auVar135 = vfmadd213sd_fma(ZEXT816(0) << 0x40,local_348,auVar319);
    local_330 = auVar135._0_8_;
    auVar377._0_8_ = auVar206._0_8_ * dVar186;
    auVar377._8_8_ = auVar206._8_8_ * dVar186;
    auVar420._8_8_ = local_348._0_8_;
    auVar420._0_8_ = local_348._0_8_;
    auVar135 = vfmadd231pd_fma(auVar377,auVar179,auVar420);
    auVar320._0_8_ = auVar179._0_8_ * dVar186;
    auVar320._8_8_ = auVar179._8_8_ * dVar186;
    auVar206 = vfmsub231pd_fma(auVar320,auVar206,auVar420);
    auVar212._8_8_ = 0;
    auVar212._0_8_ = dVar186 * -0.0;
    auVar205 = vfmadd231sd_fma(auVar212,auVar205,local_348);
    auVar179 = auVar135;
  }
  else {
    local_330 = 0.0;
  }
  if (0 < this->nx) {
    dVar176 = (double)((ulong)(sscos == 1) * (long)(xsigma * 0.822) +
                      (ulong)(sscos != 1) * (long)(((xsigma + xsigma) * 2.5066282746310002) / 3.0));
    dVar376 = (sigma0 * 0.5) / 0.29356228701531506;
    auVar165._12_4_ = 0x80000000;
    auVar165._0_12_ = ZEXT812(0x8000000000000000);
    dVar187 = -x0;
    uVar316 = auVar165._8_8_ ^ in_XMM4_Qb;
    dVar4 = (double)iVar123 * dVar4 * -0.5;
    dVar5 = (double)iVar124 * dVar5 * -0.5;
    __x = dVar133 / dVar127;
    dVar188 = 3.141592653589793 / dVar176;
    dVar189 = -dVar188;
    dVar190 = -K;
    dVar186 = dVar176 * dVar176 * dVar176 * dVar176;
    auVar177 = vshufpd_avx(auVar177,auVar442,1);
    auVar135 = vshufpd_avx(auVar206,auVar206,1);
    auVar129 = vshufpd_avx(auVar179,auVar179,1);
    auVar168._8_8_ = in_XMM1_Qb;
    auVar168._0_8_ = a0z;
    auVar156._8_8_ = in_XMM0_Qb;
    auVar156._0_8_ = a0y;
    auVar131 = vunpcklpd_avx(auVar168,auVar156);
    lVar174 = 0;
    do {
      if (0 < this->ny) {
        dVar191 = (double)(int)lVar174;
        lVar173 = 0;
        do {
          if (0 < this->nz) {
            dVar192 = (double)(int)lVar173;
            lVar172 = 0;
            lVar175 = 0;
            do {
              auVar213._8_8_ = 0;
              auVar213._0_8_ = this->dx;
              auVar321._8_8_ = 0;
              auVar321._0_8_ = dVar191;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dVar187;
              auVar446 = vfmadd213sd_fma(auVar213,auVar321,auVar6);
              dVar197 = auVar446._0_8_ - xtarget;
              auVar214._8_8_ = 0;
              auVar214._0_8_ = this->dy;
              auVar378._8_8_ = 0;
              auVar378._0_8_ = dVar192;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = dVar4;
              auVar446 = vfmadd213sd_fma(auVar214,auVar378,auVar7);
              dVar193 = (auVar446._0_8_ - y0) - ytarget;
              auVar421._0_8_ = (double)(int)lVar175;
              auVar421._8_8_ = in_XMM14_Qb;
              auVar322._8_8_ = 0;
              auVar322._0_8_ = dVar197;
              auVar434._8_8_ = 0;
              auVar434._0_8_ = dVar193 * dVar185;
              auVar433 = vfmadd231sd_fma(auVar434,auVar441,auVar322);
              auVar379._8_8_ = 0;
              auVar379._0_8_ = this->dz;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = dVar5;
              auVar446 = vfmadd213sd_fma(auVar379,auVar421,auVar8);
              dVar194 = (auVar446._0_8_ - z0) - ztarget;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = auVar178._0_8_;
              auVar380._8_8_ = 0;
              auVar380._0_8_ = dVar194;
              auVar446 = vfmadd231sd_fma(auVar433,auVar380,auVar9);
              auVar215._8_8_ = 0;
              auVar215._0_8_ = dVar193 * dVar193;
              auVar323._8_8_ = 0;
              auVar323._0_8_ = dVar197;
              auVar433 = vfmadd231sd_fma(auVar215,auVar322,auVar323);
              auVar381._8_8_ = 0;
              auVar381._0_8_ = dVar194;
              auVar433 = vfmadd231sd_fma(auVar433,auVar380,auVar381);
              dVar197 = auVar446._0_8_;
              auVar446 = vfnmadd231sd_fma(auVar433,auVar446,auVar446);
              if (auVar446._0_8_ < 0.0) {
                dVar193 = sqrt(auVar446._0_8_);
              }
              else {
                auVar446 = vsqrtsd_avx(auVar446,auVar446);
                dVar193 = auVar446._0_8_;
              }
              dVar130 = dVar197 - dVar133;
              auVar382._8_8_ = 0;
              auVar382._0_8_ = dVar130;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = dVar128;
              auVar446 = vfmadd213sd_fma(auVar382,auVar382,auVar10);
              dVar419 = auVar446._0_8_;
              dVar194 = atan(dVar130 / dVar127);
              dVar195 = atan(__x);
              dVar195 = ((dVar197 + (dVar193 * dVar193 * 0.5 * dVar130) / dVar419) - dVar194) -
                        dVar195;
              dVar194 = atan(__x);
              dVar196 = atan(__x);
              dVar194 = ((dVar196 + (dVar195 - dVar133)) * (dVar194 + (dVar195 - dVar133))) /
                        dVar128 + 1.0;
              if (dVar194 < 0.0) {
                dVar194 = sqrt(dVar194);
              }
              else {
                auVar216._8_8_ = 0;
                auVar216._0_8_ = dVar194;
                auVar446 = vsqrtsd_avx(auVar216,auVar216);
                dVar194 = auVar446._0_8_;
              }
              if (((dVar195 <= -dVar176) || (dVar176 <= dVar195)) ||
                 (dVar194 = dVar194 * dVar376, dVar194 <= dVar193)) {
                if (!append) {
                  pcVar125 = (this->ce).p._M_t.
                             super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                             super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar174][lVar173];
                  *(undefined8 *)((long)&pcVar125->ez + lVar172) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar125->ex + lVar172);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  pcVar126 = (this->cb).p._M_t.
                             super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                             super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar174][lVar173];
                  *(undefined8 *)((long)&pcVar126->bz + lVar172) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar126->bx + lVar172);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                }
              }
              else {
                dVar196 = (((sigma0 * dVar182 * 0.5) / 0.29356228701531506) / dVar194) *
                          (dVar183 / dVar184);
                local_88 = auVar131._0_8_;
                dStack_80 = auVar131._8_8_;
                local_208 = auVar129._0_8_;
                local_298 = auVar179._0_8_;
                local_1f8 = auVar135._0_8_;
                local_2a8 = auVar206._0_8_;
                local_258 = auVar205._0_8_;
                if (sscos == 1) {
                  dVar197 = (dVar195 * dVar195 * dVar195 * dVar195 * 3.141592653589793 * 0.5) /
                            dVar186;
                  local_348._0_8_ = cos(dVar197);
                  local_348._8_8_ = extraout_XMM0_Qb_00;
                  dVar198 = (dVar193 * 3.141592653589793 * 0.5) / dVar194;
                  dVar199 = cos(dVar198);
                  dVar197 = sin(dVar197);
                  dVar200 = sin(dVar198);
                  auVar324._8_8_ = 0;
                  auVar324._0_8_ = dVar195;
                  auVar217._8_8_ = 0;
                  auVar217._0_8_ = K;
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = phase;
                  auVar446 = vfmadd213sd_fma(auVar324,auVar217,auVar11);
                  dVar204 = auVar446._0_8_;
                  local_188._0_8_ = cos(dVar204);
                  local_188._8_8_ = extraout_XMM0_Qb_01;
                  local_378._0_8_ = (dVar195 * dVar195 * dVar195 * 12.566370614359172) / dVar186;
                  local_378._8_8_ = 0;
                  dVar195 = sin(dVar204);
                  uStack_270 = (undefined4)extraout_XMM0_Qb_02;
                  uStack_26c = (undefined4)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                  dVar317 = -(double)local_378._0_8_;
                  local_2b8._8_8_ = 0x8000000000000000;
                  local_2b8._0_8_ = -dVar196;
                  dVar198 = sin(dVar204);
                  auVar314._0_8_ = cos(dVar204);
                  auVar314._8_56_ = extraout_var_00;
                  auVar159._8_8_ = 0;
                  auVar159._0_8_ = dVar196;
                  auVar446 = vunpcklpd_avx(local_2b8,auVar159);
                  auVar383._0_8_ = auVar446._0_8_ * local_88;
                  auVar383._8_8_ = auVar446._8_8_ * dStack_80;
                  auVar433 = vshufpd_avx(auVar383,auVar383,1);
                  auVar444 = ZEXT816(0) << 0x40;
                  if ((dVar193 != 0.0) || (NAN(dVar193))) {
                    dVar440 = (dVar199 * dVar200 * 3.141592653589793) / dVar194;
                    auVar218._8_8_ = 0;
                    auVar218._0_8_ = this->dx;
                    auVar140._8_8_ = uVar316;
                    auVar140._0_8_ = dVar187;
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = dVar191;
                    auVar446 = vfmadd132sd_fma(auVar218,auVar140,auVar12);
                    auVar325._8_8_ = 0;
                    auVar325._0_8_ = this->dy;
                    auVar422._8_8_ = 0;
                    auVar422._0_8_ = dVar192;
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = dVar4;
                    auVar207 = vfmadd213sd_fma(auVar325,auVar422,auVar13);
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = local_298;
                    auVar219._8_8_ = 0;
                    auVar219._0_8_ = auVar446._0_8_ - xtarget;
                    auVar326._8_8_ = 0;
                    auVar326._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_208;
                    auVar207 = vfmadd231sd_fma(auVar326,auVar219,auVar14);
                    auVar220._8_8_ = 0;
                    auVar220._0_8_ = this->dz;
                    auVar384._8_8_ = 0;
                    auVar384._0_8_ = auVar421._0_8_;
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = dVar5;
                    auVar446 = vfmadd213sd_fma(auVar220,auVar384,auVar15);
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = local_330;
                    auVar221._8_8_ = 0;
                    auVar221._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                    auVar446 = vfmadd132sd_fma(auVar221,auVar207,auVar16);
                    dVar201 = sin(dVar204);
                    dVar202 = cos(dVar204);
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = dVar201 * K * (double)local_348._0_8_;
                    auVar222._8_8_ = 0;
                    auVar222._0_8_ =
                         (double)local_348._0_8_ * dVar202 * (double)local_378._0_8_ * dVar197;
                    auVar209 = vfmadd231sd_fma(auVar222,local_348,auVar17);
                    auVar223._8_8_ = 0;
                    auVar223._0_8_ = this->dx;
                    auVar141._8_8_ = uVar316;
                    auVar141._0_8_ = dVar187;
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = dVar191;
                    auVar207 = vfmadd132sd_fma(auVar223,auVar141,auVar18);
                    auVar327._8_8_ = 0;
                    auVar327._0_8_ = this->dy;
                    auVar385._8_8_ = 0;
                    auVar385._0_8_ = dVar192;
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = dVar4;
                    auVar208 = vfmadd213sd_fma(auVar327,auVar385,auVar19);
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = local_298;
                    auVar224._8_8_ = 0;
                    auVar224._0_8_ = auVar207._0_8_ - xtarget;
                    auVar328._8_8_ = 0;
                    auVar328._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_208;
                    auVar208 = vfmadd231sd_fma(auVar328,auVar224,auVar20);
                    auVar225._8_8_ = 0;
                    auVar225._0_8_ = this->dz;
                    auVar386._8_8_ = 0;
                    auVar386._0_8_ = auVar421._0_8_;
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = dVar5;
                    auVar207 = vfmadd213sd_fma(auVar225,auVar386,auVar21);
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = local_330;
                    auVar226._8_8_ = 0;
                    auVar226._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                    auVar207 = vfmadd132sd_fma(auVar226,auVar208,auVar22);
                    dVar202 = cos(dVar204);
                    dVar201 = (double)local_378._0_8_ * (double)local_348._0_8_ * dVar197;
                    dVar203 = sin(dVar204);
                    auVar329._8_8_ = 0;
                    auVar329._0_8_ = dVar202 * dVar190;
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = (double)local_348._0_8_ * (double)local_348._0_8_;
                    auVar227._8_8_ = 0;
                    auVar227._0_8_ = dVar203 * dVar201;
                    auVar208 = vfmadd231sd_fma(auVar227,auVar329,auVar23);
                    auVar330._8_8_ = 0;
                    auVar330._0_8_ = auVar209._0_8_;
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = (dVar440 * auVar446._0_8_) / dVar193;
                    auVar228._8_8_ = 0;
                    auVar228._0_8_ =
                         auVar208._0_8_ * dVar199 * dVar199 * ((auVar207._0_8_ * dVar130) / dVar419)
                    ;
                    auVar446 = vfmadd231sd_fma(auVar228,auVar330,auVar24);
                    auVar240._0_8_ = auVar446._0_8_;
                    auVar229._8_8_ = 0;
                    auVar229._0_8_ = this->dx;
                    auVar142._8_8_ = uVar316;
                    auVar142._0_8_ = dVar187;
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = dVar191;
                    auVar446 = vfmadd132sd_fma(auVar229,auVar142,auVar25);
                    auVar331._8_8_ = 0;
                    auVar331._0_8_ = this->dy;
                    auVar387._8_8_ = 0;
                    auVar387._0_8_ = dVar192;
                    auVar26._8_8_ = 0;
                    auVar26._0_8_ = dVar4;
                    auVar207 = vfmadd213sd_fma(auVar331,auVar387,auVar26);
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = local_2a8;
                    auVar230._8_8_ = 0;
                    auVar230._0_8_ = auVar446._0_8_ - xtarget;
                    auVar332._8_8_ = 0;
                    auVar332._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_1f8;
                    auVar207 = vfmadd231sd_fma(auVar332,auVar230,auVar27);
                    auVar231._8_8_ = 0;
                    auVar231._0_8_ = this->dz;
                    auVar388._8_8_ = 0;
                    auVar388._0_8_ = auVar421._0_8_;
                    auVar28._8_8_ = 0;
                    auVar28._0_8_ = dVar5;
                    auVar446 = vfmadd213sd_fma(auVar231,auVar388,auVar28);
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = local_258;
                    auVar232._8_8_ = 0;
                    auVar232._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                    auVar446 = vfmadd132sd_fma(auVar232,auVar207,auVar29);
                    dVar202 = cos(dVar204);
                    dVar203 = sin(dVar204);
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = dVar202 * dVar190 * (double)local_348._0_8_;
                    auVar233._8_8_ = 0;
                    auVar233._0_8_ = (double)local_348._0_8_ * dVar203 * dVar317 * dVar197;
                    auVar209 = vfmadd231sd_fma(auVar233,local_348,auVar30);
                    auVar234._8_8_ = 0;
                    auVar234._0_8_ = this->dx;
                    auVar143._8_8_ = uVar316;
                    auVar143._0_8_ = dVar187;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = dVar191;
                    auVar207 = vfmadd132sd_fma(auVar234,auVar143,auVar31);
                    auVar333._8_8_ = 0;
                    auVar333._0_8_ = this->dy;
                    auVar389._8_8_ = 0;
                    auVar389._0_8_ = dVar192;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = dVar4;
                    auVar208 = vfmadd213sd_fma(auVar333,auVar389,auVar32);
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = local_2a8;
                    auVar235._8_8_ = 0;
                    auVar235._0_8_ = auVar207._0_8_ - xtarget;
                    auVar334._8_8_ = 0;
                    auVar334._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_1f8;
                    auVar208 = vfmadd231sd_fma(auVar334,auVar235,auVar33);
                    auVar236._8_8_ = 0;
                    auVar236._0_8_ = this->dz;
                    auVar390._8_8_ = 0;
                    auVar390._0_8_ = auVar421._0_8_;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = dVar5;
                    auVar207 = vfmadd213sd_fma(auVar236,auVar390,auVar34);
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = local_258;
                    auVar237._8_8_ = 0;
                    auVar237._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                    auVar207 = vfmadd132sd_fma(auVar237,auVar208,auVar35);
                    dVar202 = sin(dVar204);
                    dVar203 = cos(dVar204);
                    auVar335._8_8_ = 0;
                    auVar335._0_8_ = dVar202 * dVar190;
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = (double)local_348._0_8_ * (double)local_348._0_8_;
                    auVar238._8_8_ = 0;
                    auVar238._0_8_ = dVar203 * dVar201;
                    auVar208 = vfmsub231sd_fma(auVar238,auVar335,auVar36);
                    auVar336._8_8_ = 0;
                    auVar336._0_8_ = auVar209._0_8_;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = (auVar446._0_8_ * dVar440) / dVar193;
                    auVar239._8_8_ = 0;
                    auVar239._0_8_ =
                         auVar208._0_8_ * dVar199 * dVar199 * ((auVar207._0_8_ * dVar130) / dVar419)
                    ;
                    auVar446 = vfmadd231sd_fma(auVar239,auVar336,auVar37);
                    auVar240._8_8_ = 0;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = auVar433._0_8_ / K;
                    auVar443._8_8_ = 0;
                    auVar443._0_8_ = (auVar383._0_8_ / K) * auVar446._0_8_;
                    auVar444 = vfmadd231sd_fma(auVar443,auVar240,auVar38);
                  }
                  auVar446 = SUB6416(ZEXT864(0),0);
                  auVar241._0_8_ = dVar199 * auVar383._0_8_ * dVar199;
                  auVar241._8_8_ = dVar199 * auVar383._8_8_ * dVar199;
                  auVar169._8_8_ = K;
                  auVar169._0_8_ = K;
                  auVar207 = vdivpd_avx(auVar241,auVar169);
                  auVar161._8_8_ = extraout_XMM0_Qb_03;
                  auVar161._0_8_ = dVar198;
                  auVar208 = vunpcklpd_avx(auVar161,local_188);
                  auVar391._8_8_ = local_348._0_8_;
                  auVar391._0_8_ = local_348._0_8_;
                  auVar337._0_8_ = (double)local_348._0_8_ * auVar208._0_8_ * K;
                  auVar337._8_8_ = (double)local_348._0_8_ * auVar208._8_8_ * K;
                  auVar157._8_4_ = uStack_270;
                  auVar157._0_8_ = dVar195;
                  auVar157._12_4_ = uStack_26c;
                  auVar208 = vunpcklpd_avx(local_378,auVar157);
                  auVar162._8_8_ = 0x8000000000000000;
                  auVar162._0_8_ = dVar317;
                  auVar209 = vunpcklpd_avx(auVar314._0_16_,auVar162);
                  auVar423._0_8_ =
                       dVar197 * (double)local_348._0_8_ * auVar208._0_8_ * auVar209._0_8_;
                  auVar423._8_8_ =
                       dVar197 * (double)local_348._0_8_ * auVar208._8_8_ * auVar209._8_8_;
                  auVar208 = vfmadd231pd_fma(auVar423,auVar391,auVar337);
                  local_188._0_8_ = auVar207._0_8_ * auVar208._0_8_;
                  local_188._8_8_ = auVar207._8_8_ * auVar208._8_8_;
                  dVar198 = -(double)local_188._0_8_;
                  if ((dVar193 != 0.0) || (NAN(dVar193))) {
                    dVar194 = (dVar200 * dVar199 * 3.141592653589793) / dVar194;
                    auVar242._8_8_ = 0;
                    auVar242._0_8_ = this->dx;
                    auVar144._8_8_ = uVar316;
                    auVar144._0_8_ = dVar187;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = dVar191;
                    auVar446 = vfmadd132sd_fma(auVar242,auVar144,auVar39);
                    auVar338._8_8_ = 0;
                    auVar338._0_8_ = this->dy;
                    auVar392._8_8_ = 0;
                    auVar392._0_8_ = dVar192;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = dVar4;
                    auVar207 = vfmadd213sd_fma(auVar338,auVar392,auVar40);
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = local_2a8;
                    auVar243._8_8_ = 0;
                    auVar243._0_8_ = auVar446._0_8_ - xtarget;
                    auVar339._8_8_ = 0;
                    auVar339._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_1f8;
                    auVar207 = vfmadd231sd_fma(auVar339,auVar243,auVar41);
                    auVar244._8_8_ = 0;
                    auVar244._0_8_ = this->dz;
                    auVar393._8_8_ = 0;
                    auVar393._0_8_ = auVar421._0_8_;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = dVar5;
                    auVar446 = vfmadd213sd_fma(auVar244,auVar393,auVar42);
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = local_258;
                    auVar245._8_8_ = 0;
                    auVar245._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                    auVar446 = vfmadd132sd_fma(auVar245,auVar207,auVar43);
                    local_1d8 = auVar444._0_8_;
                    dVar195 = sin(dVar204);
                    dVar200 = cos(dVar204);
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = dVar195 * K * (double)local_348._0_8_;
                    auVar246._8_8_ = 0;
                    auVar246._0_8_ =
                         (double)local_348._0_8_ * dVar200 * (double)local_378._0_8_ * dVar197;
                    auVar209 = vfmadd231sd_fma(auVar246,local_348,auVar44);
                    auVar247._8_8_ = 0;
                    auVar247._0_8_ = this->dx;
                    auVar145._8_8_ = uVar316;
                    auVar145._0_8_ = dVar187;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = dVar191;
                    auVar207 = vfmadd132sd_fma(auVar247,auVar145,auVar45);
                    auVar340._8_8_ = 0;
                    auVar340._0_8_ = this->dy;
                    auVar394._8_8_ = 0;
                    auVar394._0_8_ = dVar192;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = dVar4;
                    auVar208 = vfmadd213sd_fma(auVar340,auVar394,auVar46);
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = local_2a8;
                    auVar248._8_8_ = 0;
                    auVar248._0_8_ = auVar207._0_8_ - xtarget;
                    auVar341._8_8_ = 0;
                    auVar341._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_1f8;
                    auVar208 = vfmadd231sd_fma(auVar341,auVar248,auVar47);
                    auVar249._8_8_ = 0;
                    auVar249._0_8_ = this->dz;
                    auVar395._8_8_ = 0;
                    auVar395._0_8_ = auVar421._0_8_;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = dVar5;
                    auVar207 = vfmadd213sd_fma(auVar249,auVar395,auVar48);
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = local_258;
                    auVar250._8_8_ = 0;
                    auVar250._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                    auVar207 = vfmadd132sd_fma(auVar250,auVar208,auVar49);
                    dVar200 = cos(dVar204);
                    dVar195 = (double)local_378._0_8_ * (double)local_348._0_8_ * dVar197;
                    dVar201 = sin(dVar204);
                    auVar342._8_8_ = 0;
                    auVar342._0_8_ = dVar200 * dVar190;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = (double)local_348._0_8_ * (double)local_348._0_8_;
                    auVar251._8_8_ = 0;
                    auVar251._0_8_ = dVar201 * dVar195;
                    auVar208 = vfmadd231sd_fma(auVar251,auVar342,auVar50);
                    auVar343._8_8_ = 0;
                    auVar343._0_8_ = auVar209._0_8_;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = (dVar194 * auVar446._0_8_) / dVar193;
                    auVar252._8_8_ = 0;
                    auVar252._0_8_ =
                         auVar208._0_8_ * dVar199 * dVar199 * ((auVar207._0_8_ * dVar130) / dVar419)
                    ;
                    auVar446 = vfmadd231sd_fma(auVar252,auVar343,auVar51);
                    auVar264._0_8_ = auVar446._0_8_;
                    auVar253._8_8_ = 0;
                    auVar253._0_8_ = this->dx;
                    auVar146._8_8_ = uVar316;
                    auVar146._0_8_ = dVar187;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = dVar191;
                    auVar446 = vfmadd132sd_fma(auVar253,auVar146,auVar52);
                    auVar344._8_8_ = 0;
                    auVar344._0_8_ = this->dy;
                    auVar396._8_8_ = 0;
                    auVar396._0_8_ = dVar192;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = dVar4;
                    auVar207 = vfmadd213sd_fma(auVar344,auVar396,auVar53);
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = local_298;
                    auVar254._8_8_ = 0;
                    auVar254._0_8_ = auVar446._0_8_ - xtarget;
                    auVar345._8_8_ = 0;
                    auVar345._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_208;
                    auVar207 = vfmadd231sd_fma(auVar345,auVar254,auVar54);
                    auVar255._8_8_ = 0;
                    auVar255._0_8_ = this->dz;
                    auVar397._8_8_ = 0;
                    auVar397._0_8_ = auVar421._0_8_;
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = dVar5;
                    auVar446 = vfmadd213sd_fma(auVar255,auVar397,auVar55);
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = local_330;
                    auVar256._8_8_ = 0;
                    auVar256._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                    auVar446 = vfmadd132sd_fma(auVar256,auVar207,auVar56);
                    dVar200 = cos(dVar204);
                    dVar201 = sin(dVar204);
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = dVar200 * dVar190 * (double)local_348._0_8_;
                    auVar257._8_8_ = 0;
                    auVar257._0_8_ = (double)local_348._0_8_ * dVar201 * dVar317 * dVar197;
                    auVar209 = vfmadd231sd_fma(auVar257,local_348,auVar57);
                    auVar258._8_8_ = 0;
                    auVar258._0_8_ = this->dx;
                    auVar147._8_8_ = uVar316;
                    auVar147._0_8_ = dVar187;
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = dVar191;
                    auVar207 = vfmadd132sd_fma(auVar258,auVar147,auVar58);
                    auVar346._8_8_ = 0;
                    auVar346._0_8_ = this->dy;
                    auVar398._8_8_ = 0;
                    auVar398._0_8_ = dVar192;
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = dVar4;
                    auVar208 = vfmadd213sd_fma(auVar346,auVar398,auVar59);
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = local_298;
                    auVar259._8_8_ = 0;
                    auVar259._0_8_ = auVar207._0_8_ - xtarget;
                    auVar347._8_8_ = 0;
                    auVar347._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_208;
                    auVar208 = vfmadd231sd_fma(auVar347,auVar259,auVar60);
                    auVar260._8_8_ = 0;
                    auVar260._0_8_ = auVar421._0_8_;
                    auVar399._8_8_ = 0;
                    auVar399._0_8_ = dVar5;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = this->dz;
                    auVar207 = vfmadd132sd_fma(auVar260,auVar399,auVar61);
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = local_330;
                    auVar261._8_8_ = 0;
                    auVar261._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                    auVar207 = vfmadd132sd_fma(auVar261,auVar208,auVar62);
                    dVar197 = sin(dVar204);
                    dVar200 = cos(dVar204);
                    auVar348._8_8_ = 0;
                    auVar348._0_8_ = dVar197 * dVar190;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = (double)local_348._0_8_ * (double)local_348._0_8_;
                    auVar262._8_8_ = 0;
                    auVar262._0_8_ = dVar200 * dVar195;
                    auVar208 = vfmsub231sd_fma(auVar262,auVar348,auVar63);
                    auVar349._8_8_ = 0;
                    auVar349._0_8_ = auVar209._0_8_;
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = (auVar446._0_8_ * dVar194) / dVar193;
                    auVar263._8_8_ = 0;
                    auVar263._0_8_ =
                         auVar208._0_8_ * dVar199 * dVar199 * ((auVar207._0_8_ * dVar130) / dVar419)
                    ;
                    auVar446 = vfmadd231sd_fma(auVar263,auVar349,auVar64);
                    auVar264._8_8_ = 0;
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = auVar433._0_8_ / K;
                    auVar447._8_8_ = 0;
                    auVar447._0_8_ = auVar446._0_8_ * ((dVar196 * a0z) / K);
                    auVar446 = vfmadd231sd_fma(auVar447,auVar264,auVar65);
LAB_0011177e:
                    auVar444._8_8_ = 0;
                    auVar444._0_8_ = local_1d8;
                  }
                  else {
LAB_00112427:
                    auVar446 = auVar446 << 0x40;
                  }
                }
                else {
                  local_188 = SUB6416(ZEXT864(0),0) << 0x40;
                  auVar444 = SUB6416(ZEXT864(0),0) << 0x40;
                  if (((dVar133 - dVar197) * dVar376 * -2.0) / dVar127 <= dVar193) {
                    auVar446 = ZEXT816(0);
                    dVar198 = 0.0;
                    if (dVar193 <= ((dVar133 - dVar197) * (dVar376 + dVar376)) / dVar127) {
                      dVar197 = (dVar195 * 3.141592653589793 * 0.5) / dVar176;
                      dVar199 = cos(dVar197);
                      dVar198 = (dVar193 * 3.141592653589793 * 0.5) / dVar194;
                      dVar200 = cos(dVar198);
                      dVar197 = sin(dVar197);
                      dVar204 = sin(dVar198);
                      auVar265._8_8_ = 0;
                      auVar265._0_8_ = K;
                      auVar350._8_8_ = 0;
                      auVar350._0_8_ = dVar195;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = phase;
                      auVar446 = vfmadd213sd_fma(auVar350,auVar265,auVar66);
                      dVar317 = auVar446._0_8_;
                      dVar195 = cos(dVar317);
                      dVar198 = sin(dVar317);
                      local_188._0_8_ = sin(dVar317);
                      local_188._8_8_ = extraout_XMM0_Qb_07;
                      auVar315._0_8_ = cos(dVar317);
                      auVar315._8_56_ = extraout_var_01;
                      auVar158._8_4_ = 0;
                      auVar158._0_8_ = -dVar196;
                      auVar158._12_4_ = 0x80000000;
                      auVar160._8_8_ = 0;
                      auVar160._0_8_ = dVar196;
                      auVar446 = vunpcklpd_avx(auVar158,auVar160);
                      auVar400._0_8_ = auVar446._0_8_ * local_88;
                      auVar400._8_8_ = auVar446._8_8_ * dStack_80;
                      auVar433 = vshufpd_avx(auVar400,auVar400,1);
                      auVar444 = ZEXT816(0) << 0x40;
                      if ((dVar193 != 0.0) || (NAN(dVar193))) {
                        dVar440 = (dVar200 * dVar204 * 3.141592653589793) / dVar194;
                        auVar266._8_8_ = 0;
                        auVar266._0_8_ = this->dx;
                        auVar148._8_8_ = uVar316;
                        auVar148._0_8_ = dVar187;
                        auVar67._8_8_ = 0;
                        auVar67._0_8_ = dVar191;
                        auVar446 = vfmadd132sd_fma(auVar266,auVar148,auVar67);
                        auVar351._8_8_ = 0;
                        auVar351._0_8_ = this->dy;
                        auVar424._8_8_ = 0;
                        auVar424._0_8_ = dVar192;
                        auVar68._8_8_ = 0;
                        auVar68._0_8_ = dVar4;
                        auVar207 = vfmadd213sd_fma(auVar351,auVar424,auVar68);
                        auVar69._8_8_ = 0;
                        auVar69._0_8_ = local_298;
                        auVar267._8_8_ = 0;
                        auVar267._0_8_ = auVar446._0_8_ - xtarget;
                        auVar352._8_8_ = 0;
                        auVar352._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_208;
                        auVar207 = vfmadd231sd_fma(auVar352,auVar267,auVar69);
                        auVar268._8_8_ = 0;
                        auVar268._0_8_ = this->dz;
                        auVar401._8_8_ = 0;
                        auVar401._0_8_ = auVar421._0_8_;
                        auVar70._8_8_ = 0;
                        auVar70._0_8_ = dVar5;
                        auVar446 = vfmadd213sd_fma(auVar268,auVar401,auVar70);
                        auVar71._8_8_ = 0;
                        auVar71._0_8_ = local_330;
                        auVar269._8_8_ = 0;
                        auVar269._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                        auVar446 = vfmadd132sd_fma(auVar269,auVar207,auVar71);
                        dVar201 = sin(dVar317);
                        dVar202 = cos(dVar317);
                        auVar136._8_8_ = extraout_XMM0_Qb_04;
                        auVar136._0_8_ = dVar199;
                        auVar72._8_8_ = 0;
                        auVar72._0_8_ = dVar201 * K * dVar199;
                        auVar270._8_8_ = 0;
                        auVar270._0_8_ = dVar199 * dVar202 * dVar188 * dVar197;
                        auVar209 = vfmadd231sd_fma(auVar270,auVar136,auVar72);
                        auVar271._8_8_ = 0;
                        auVar271._0_8_ = this->dx;
                        auVar149._8_8_ = uVar316;
                        auVar149._0_8_ = dVar187;
                        auVar73._8_8_ = 0;
                        auVar73._0_8_ = dVar191;
                        auVar207 = vfmadd132sd_fma(auVar271,auVar149,auVar73);
                        auVar353._8_8_ = 0;
                        auVar353._0_8_ = this->dy;
                        auVar402._8_8_ = 0;
                        auVar402._0_8_ = dVar192;
                        auVar74._8_8_ = 0;
                        auVar74._0_8_ = dVar4;
                        auVar208 = vfmadd213sd_fma(auVar353,auVar402,auVar74);
                        auVar75._8_8_ = 0;
                        auVar75._0_8_ = local_298;
                        auVar272._8_8_ = 0;
                        auVar272._0_8_ = auVar207._0_8_ - xtarget;
                        auVar354._8_8_ = 0;
                        auVar354._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_208;
                        auVar208 = vfmadd231sd_fma(auVar354,auVar272,auVar75);
                        auVar273._8_8_ = 0;
                        auVar273._0_8_ = this->dz;
                        auVar403._8_8_ = 0;
                        auVar403._0_8_ = auVar421._0_8_;
                        auVar76._8_8_ = 0;
                        auVar76._0_8_ = dVar5;
                        auVar207 = vfmadd213sd_fma(auVar273,auVar403,auVar76);
                        auVar77._8_8_ = 0;
                        auVar77._0_8_ = local_330;
                        auVar274._8_8_ = 0;
                        auVar274._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                        auVar207 = vfmadd132sd_fma(auVar274,auVar208,auVar77);
                        dVar202 = cos(dVar317);
                        dVar201 = dVar188 * dVar199 * dVar197;
                        dVar203 = sin(dVar317);
                        auVar355._8_8_ = 0;
                        auVar355._0_8_ = dVar202 * dVar190;
                        auVar78._8_8_ = 0;
                        auVar78._0_8_ = dVar199 * dVar199;
                        auVar275._8_8_ = 0;
                        auVar275._0_8_ = dVar203 * dVar201;
                        auVar208 = vfmadd231sd_fma(auVar275,auVar355,auVar78);
                        auVar356._8_8_ = 0;
                        auVar356._0_8_ = auVar209._0_8_;
                        auVar79._8_8_ = 0;
                        auVar79._0_8_ = (dVar440 * auVar446._0_8_) / dVar193;
                        auVar276._8_8_ = 0;
                        auVar276._0_8_ =
                             auVar208._0_8_ *
                             dVar200 * dVar200 * ((auVar207._0_8_ * dVar130) / dVar419);
                        auVar446 = vfmadd231sd_fma(auVar276,auVar356,auVar79);
                        auVar288._0_8_ = auVar446._0_8_;
                        auVar277._8_8_ = 0;
                        auVar277._0_8_ = this->dx;
                        auVar150._8_8_ = uVar316;
                        auVar150._0_8_ = dVar187;
                        auVar80._8_8_ = 0;
                        auVar80._0_8_ = dVar191;
                        auVar446 = vfmadd132sd_fma(auVar277,auVar150,auVar80);
                        auVar357._8_8_ = 0;
                        auVar357._0_8_ = this->dy;
                        auVar404._8_8_ = 0;
                        auVar404._0_8_ = dVar192;
                        auVar81._8_8_ = 0;
                        auVar81._0_8_ = dVar4;
                        auVar207 = vfmadd213sd_fma(auVar357,auVar404,auVar81);
                        auVar82._8_8_ = 0;
                        auVar82._0_8_ = local_2a8;
                        auVar278._8_8_ = 0;
                        auVar278._0_8_ = auVar446._0_8_ - xtarget;
                        auVar358._8_8_ = 0;
                        auVar358._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_1f8;
                        auVar207 = vfmadd231sd_fma(auVar358,auVar278,auVar82);
                        auVar279._8_8_ = 0;
                        auVar279._0_8_ = this->dz;
                        auVar405._8_8_ = 0;
                        auVar405._0_8_ = auVar421._0_8_;
                        auVar83._8_8_ = 0;
                        auVar83._0_8_ = dVar5;
                        auVar446 = vfmadd213sd_fma(auVar279,auVar405,auVar83);
                        auVar84._8_8_ = 0;
                        auVar84._0_8_ = local_258;
                        auVar280._8_8_ = 0;
                        auVar280._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                        auVar446 = vfmadd132sd_fma(auVar280,auVar207,auVar84);
                        dVar202 = cos(dVar317);
                        dVar203 = sin(dVar317);
                        auVar137._8_8_ = extraout_XMM0_Qb_04;
                        auVar137._0_8_ = dVar199;
                        auVar85._8_8_ = 0;
                        auVar85._0_8_ = dVar202 * dVar190 * dVar199;
                        auVar281._8_8_ = 0;
                        auVar281._0_8_ = dVar199 * dVar203 * dVar189 * dVar197;
                        auVar209 = vfmadd231sd_fma(auVar281,auVar137,auVar85);
                        auVar282._8_8_ = 0;
                        auVar282._0_8_ = this->dx;
                        auVar151._8_8_ = uVar316;
                        auVar151._0_8_ = dVar187;
                        auVar86._8_8_ = 0;
                        auVar86._0_8_ = dVar191;
                        auVar207 = vfmadd132sd_fma(auVar282,auVar151,auVar86);
                        auVar359._8_8_ = 0;
                        auVar359._0_8_ = this->dy;
                        auVar406._8_8_ = 0;
                        auVar406._0_8_ = dVar192;
                        auVar87._8_8_ = 0;
                        auVar87._0_8_ = dVar4;
                        auVar208 = vfmadd213sd_fma(auVar359,auVar406,auVar87);
                        auVar88._8_8_ = 0;
                        auVar88._0_8_ = local_2a8;
                        auVar283._8_8_ = 0;
                        auVar283._0_8_ = auVar207._0_8_ - xtarget;
                        auVar360._8_8_ = 0;
                        auVar360._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_1f8;
                        auVar208 = vfmadd231sd_fma(auVar360,auVar283,auVar88);
                        auVar284._8_8_ = 0;
                        auVar284._0_8_ = this->dz;
                        auVar407._8_8_ = 0;
                        auVar407._0_8_ = auVar421._0_8_;
                        auVar89._8_8_ = 0;
                        auVar89._0_8_ = dVar5;
                        auVar207 = vfmadd213sd_fma(auVar284,auVar407,auVar89);
                        auVar90._8_8_ = 0;
                        auVar90._0_8_ = local_258;
                        auVar285._8_8_ = 0;
                        auVar285._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                        auVar207 = vfmadd132sd_fma(auVar285,auVar208,auVar90);
                        dVar202 = sin(dVar317);
                        dVar203 = cos(dVar317);
                        auVar361._8_8_ = 0;
                        auVar361._0_8_ = dVar202 * dVar190;
                        auVar91._8_8_ = 0;
                        auVar91._0_8_ = dVar199 * dVar199;
                        auVar286._8_8_ = 0;
                        auVar286._0_8_ = dVar203 * dVar201;
                        auVar208 = vfmsub231sd_fma(auVar286,auVar361,auVar91);
                        auVar362._8_8_ = 0;
                        auVar362._0_8_ = auVar209._0_8_;
                        auVar92._8_8_ = 0;
                        auVar92._0_8_ = (auVar446._0_8_ * dVar440) / dVar193;
                        auVar287._8_8_ = 0;
                        auVar287._0_8_ =
                             auVar208._0_8_ *
                             dVar200 * dVar200 * ((auVar207._0_8_ * dVar130) / dVar419);
                        auVar446 = vfmadd231sd_fma(auVar287,auVar362,auVar92);
                        auVar288._8_8_ = 0;
                        auVar93._8_8_ = 0;
                        auVar93._0_8_ = auVar433._0_8_ / K;
                        auVar445._8_8_ = 0;
                        auVar445._0_8_ = (auVar400._0_8_ / K) * auVar446._0_8_;
                        auVar444 = vfmadd231sd_fma(auVar445,auVar288,auVar93);
                      }
                      auVar446 = SUB6416(ZEXT864(0),0);
                      auVar289._0_8_ = dVar200 * auVar400._0_8_ * dVar200;
                      auVar289._8_8_ = dVar200 * auVar400._8_8_ * dVar200;
                      auVar170._8_8_ = K;
                      auVar170._0_8_ = K;
                      auVar207 = vdivpd_avx(auVar289,auVar170);
                      auVar163._8_8_ = extraout_XMM0_Qb_05;
                      auVar163._0_8_ = dVar195;
                      auVar208 = vunpcklpd_avx(local_188,auVar163);
                      auVar408._8_8_ = dVar199;
                      auVar408._0_8_ = dVar199;
                      auVar363._0_8_ = dVar199 * auVar208._0_8_ * K;
                      auVar363._8_8_ = dVar199 * auVar208._8_8_ * K;
                      auVar166._8_8_ = 0;
                      auVar166._0_8_ = dVar188;
                      auVar164._8_8_ = extraout_XMM0_Qb_06;
                      auVar164._0_8_ = dVar198;
                      auVar208 = vunpcklpd_avx(auVar166,auVar164);
                      auVar167._8_8_ = auVar165._8_8_;
                      auVar167._0_8_ = dVar189;
                      auVar209 = vunpcklpd_avx(auVar315._0_16_,auVar167);
                      auVar425._0_8_ = dVar197 * dVar199 * auVar208._0_8_ * auVar209._0_8_;
                      auVar425._8_8_ = dVar197 * dVar199 * auVar208._8_8_ * auVar209._8_8_;
                      auVar208 = vfmadd231pd_fma(auVar425,auVar408,auVar363);
                      local_188._0_8_ = auVar207._0_8_ * auVar208._0_8_;
                      local_188._8_8_ = auVar207._8_8_ * auVar208._8_8_;
                      dVar198 = -(double)local_188._0_8_;
                      if ((dVar193 == 0.0) && (!NAN(dVar193))) goto LAB_00112427;
                      dVar194 = (dVar204 * dVar200 * 3.141592653589793) / dVar194;
                      auVar290._8_8_ = 0;
                      auVar290._0_8_ = this->dx;
                      auVar152._8_8_ = uVar316;
                      auVar152._0_8_ = dVar187;
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = dVar191;
                      auVar446 = vfmadd132sd_fma(auVar290,auVar152,auVar94);
                      auVar364._8_8_ = 0;
                      auVar364._0_8_ = this->dy;
                      auVar409._8_8_ = 0;
                      auVar409._0_8_ = dVar192;
                      auVar95._8_8_ = 0;
                      auVar95._0_8_ = dVar4;
                      auVar207 = vfmadd213sd_fma(auVar364,auVar409,auVar95);
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ = local_2a8;
                      auVar291._8_8_ = 0;
                      auVar291._0_8_ = auVar446._0_8_ - xtarget;
                      auVar365._8_8_ = 0;
                      auVar365._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_1f8;
                      auVar207 = vfmadd231sd_fma(auVar365,auVar291,auVar96);
                      auVar292._8_8_ = 0;
                      auVar292._0_8_ = this->dz;
                      auVar410._8_8_ = 0;
                      auVar410._0_8_ = auVar421._0_8_;
                      auVar97._8_8_ = 0;
                      auVar97._0_8_ = dVar5;
                      auVar446 = vfmadd213sd_fma(auVar292,auVar410,auVar97);
                      auVar98._8_8_ = 0;
                      auVar98._0_8_ = local_258;
                      auVar293._8_8_ = 0;
                      auVar293._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                      auVar446 = vfmadd132sd_fma(auVar293,auVar207,auVar98);
                      local_1d8 = auVar444._0_8_;
                      dVar195 = sin(dVar317);
                      dVar204 = cos(dVar317);
                      auVar138._8_8_ = extraout_XMM0_Qb_04;
                      auVar138._0_8_ = dVar199;
                      auVar99._8_8_ = 0;
                      auVar99._0_8_ = dVar195 * K * dVar199;
                      auVar294._8_8_ = 0;
                      auVar294._0_8_ = dVar199 * dVar204 * dVar188 * dVar197;
                      auVar209 = vfmadd231sd_fma(auVar294,auVar138,auVar99);
                      auVar295._8_8_ = 0;
                      auVar295._0_8_ = this->dx;
                      auVar153._8_8_ = uVar316;
                      auVar153._0_8_ = dVar187;
                      auVar100._8_8_ = 0;
                      auVar100._0_8_ = dVar191;
                      auVar207 = vfmadd132sd_fma(auVar295,auVar153,auVar100);
                      auVar366._8_8_ = 0;
                      auVar366._0_8_ = this->dy;
                      auVar411._8_8_ = 0;
                      auVar411._0_8_ = dVar192;
                      auVar101._8_8_ = 0;
                      auVar101._0_8_ = dVar4;
                      auVar208 = vfmadd213sd_fma(auVar366,auVar411,auVar101);
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = local_2a8;
                      auVar296._8_8_ = 0;
                      auVar296._0_8_ = auVar207._0_8_ - xtarget;
                      auVar367._8_8_ = 0;
                      auVar367._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_1f8;
                      auVar208 = vfmadd231sd_fma(auVar367,auVar296,auVar102);
                      auVar297._8_8_ = 0;
                      auVar297._0_8_ = this->dz;
                      auVar412._8_8_ = 0;
                      auVar412._0_8_ = auVar421._0_8_;
                      auVar103._8_8_ = 0;
                      auVar103._0_8_ = dVar5;
                      auVar207 = vfmadd213sd_fma(auVar297,auVar412,auVar103);
                      auVar104._8_8_ = 0;
                      auVar104._0_8_ = local_258;
                      auVar298._8_8_ = 0;
                      auVar298._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                      auVar207 = vfmadd132sd_fma(auVar298,auVar208,auVar104);
                      dVar204 = cos(dVar317);
                      dVar195 = dVar188 * dVar199 * dVar197;
                      dVar201 = sin(dVar317);
                      auVar368._8_8_ = 0;
                      auVar368._0_8_ = dVar204 * dVar190;
                      auVar105._8_8_ = 0;
                      auVar105._0_8_ = dVar199 * dVar199;
                      auVar299._8_8_ = 0;
                      auVar299._0_8_ = dVar201 * dVar195;
                      auVar208 = vfmadd231sd_fma(auVar299,auVar368,auVar105);
                      auVar369._8_8_ = 0;
                      auVar369._0_8_ = auVar209._0_8_;
                      auVar106._8_8_ = 0;
                      auVar106._0_8_ = (dVar194 * auVar446._0_8_) / dVar193;
                      auVar300._8_8_ = 0;
                      auVar300._0_8_ =
                           auVar208._0_8_ *
                           dVar200 * dVar200 * ((auVar207._0_8_ * dVar130) / dVar419);
                      auVar446 = vfmadd231sd_fma(auVar300,auVar369,auVar106);
                      auVar312._0_8_ = auVar446._0_8_;
                      auVar301._8_8_ = 0;
                      auVar301._0_8_ = this->dx;
                      auVar154._8_8_ = uVar316;
                      auVar154._0_8_ = dVar187;
                      auVar107._8_8_ = 0;
                      auVar107._0_8_ = dVar191;
                      auVar446 = vfmadd132sd_fma(auVar301,auVar154,auVar107);
                      auVar370._8_8_ = 0;
                      auVar370._0_8_ = this->dy;
                      auVar413._8_8_ = 0;
                      auVar413._0_8_ = dVar192;
                      auVar108._8_8_ = 0;
                      auVar108._0_8_ = dVar4;
                      auVar207 = vfmadd213sd_fma(auVar370,auVar413,auVar108);
                      auVar109._8_8_ = 0;
                      auVar109._0_8_ = local_298;
                      auVar302._8_8_ = 0;
                      auVar302._0_8_ = auVar446._0_8_ - xtarget;
                      auVar371._8_8_ = 0;
                      auVar371._0_8_ = ((auVar207._0_8_ - y0) - ytarget) * local_208;
                      auVar207 = vfmadd231sd_fma(auVar371,auVar302,auVar109);
                      auVar303._8_8_ = 0;
                      auVar303._0_8_ = this->dz;
                      auVar414._8_8_ = 0;
                      auVar414._0_8_ = auVar421._0_8_;
                      auVar110._8_8_ = 0;
                      auVar110._0_8_ = dVar5;
                      auVar446 = vfmadd213sd_fma(auVar303,auVar414,auVar110);
                      auVar111._8_8_ = 0;
                      auVar111._0_8_ = local_330;
                      auVar304._8_8_ = 0;
                      auVar304._0_8_ = (auVar446._0_8_ - z0) - ztarget;
                      auVar446 = vfmadd132sd_fma(auVar304,auVar207,auVar111);
                      dVar204 = cos(dVar317);
                      dVar201 = sin(dVar317);
                      auVar139._8_8_ = extraout_XMM0_Qb_04;
                      auVar139._0_8_ = dVar199;
                      auVar112._8_8_ = 0;
                      auVar112._0_8_ = dVar204 * dVar190 * dVar199;
                      auVar305._8_8_ = 0;
                      auVar305._0_8_ = dVar199 * dVar201 * dVar189 * dVar197;
                      auVar209 = vfmadd231sd_fma(auVar305,auVar139,auVar112);
                      auVar306._8_8_ = 0;
                      auVar306._0_8_ = this->dx;
                      auVar155._8_8_ = uVar316;
                      auVar155._0_8_ = dVar187;
                      auVar113._8_8_ = 0;
                      auVar113._0_8_ = dVar191;
                      auVar207 = vfmadd132sd_fma(auVar306,auVar155,auVar113);
                      auVar372._8_8_ = 0;
                      auVar372._0_8_ = this->dy;
                      auVar415._8_8_ = 0;
                      auVar415._0_8_ = dVar192;
                      auVar114._8_8_ = 0;
                      auVar114._0_8_ = dVar4;
                      auVar208 = vfmadd213sd_fma(auVar372,auVar415,auVar114);
                      auVar115._8_8_ = 0;
                      auVar115._0_8_ = local_298;
                      auVar307._8_8_ = 0;
                      auVar307._0_8_ = auVar207._0_8_ - xtarget;
                      auVar373._8_8_ = 0;
                      auVar373._0_8_ = ((auVar208._0_8_ - y0) - ytarget) * local_208;
                      auVar208 = vfmadd231sd_fma(auVar373,auVar307,auVar115);
                      auVar308._8_8_ = 0;
                      auVar308._0_8_ = auVar421._0_8_;
                      auVar416._8_8_ = 0;
                      auVar416._0_8_ = dVar5;
                      auVar116._8_8_ = 0;
                      auVar116._0_8_ = this->dz;
                      auVar207 = vfmadd132sd_fma(auVar308,auVar416,auVar116);
                      auVar117._8_8_ = 0;
                      auVar117._0_8_ = local_330;
                      auVar309._8_8_ = 0;
                      auVar309._0_8_ = (auVar207._0_8_ - z0) - ztarget;
                      auVar207 = vfmadd132sd_fma(auVar309,auVar208,auVar117);
                      dVar197 = sin(dVar317);
                      dVar204 = cos(dVar317);
                      auVar374._8_8_ = 0;
                      auVar374._0_8_ = dVar197 * dVar190;
                      auVar118._8_8_ = 0;
                      auVar118._0_8_ = dVar199 * dVar199;
                      auVar310._8_8_ = 0;
                      auVar310._0_8_ = dVar204 * dVar195;
                      auVar208 = vfmsub231sd_fma(auVar310,auVar374,auVar118);
                      auVar375._8_8_ = 0;
                      auVar375._0_8_ = auVar209._0_8_;
                      auVar119._8_8_ = 0;
                      auVar119._0_8_ = (auVar446._0_8_ * dVar194) / dVar193;
                      auVar311._8_8_ = 0;
                      auVar311._0_8_ =
                           auVar208._0_8_ *
                           dVar200 * dVar200 * ((auVar207._0_8_ * dVar130) / dVar419);
                      auVar446 = vfmadd231sd_fma(auVar311,auVar375,auVar119);
                      auVar312._8_8_ = 0;
                      auVar120._8_8_ = 0;
                      auVar120._0_8_ = auVar433._0_8_ / K;
                      auVar448._8_8_ = 0;
                      auVar448._0_8_ = auVar446._0_8_ * ((dVar196 * a0z) / K);
                      auVar446 = vfmadd231sd_fma(auVar448,auVar312,auVar120);
                      goto LAB_0011177e;
                    }
                  }
                  else {
                    auVar446 = ZEXT816(0);
                    dVar198 = 0.0;
                  }
                }
                auVar433 = vshufpd_avx(local_188,local_188,1);
                dVar193 = auVar433._0_8_;
                auVar180._0_8_ =
                     (ulong)b_sign * auVar446._0_8_ +
                     (ulong)!b_sign * (auVar446._0_8_ ^ 0x8000000000000000);
                auVar180._8_8_ = auVar446._8_8_ ^ 0x8000000000000000;
                dVar197 = (double)((ulong)b_sign * (long)dVar198 + (ulong)!b_sign * (long)-dVar198);
                auVar181._0_8_ = (ulong)b_sign * (long)dVar193 + (ulong)!b_sign * (long)-dVar193;
                auVar181._8_8_ = auVar433._8_8_ ^ 0x8000000000000000;
                auVar435._8_8_ = 0;
                auVar435._0_8_ = local_298 * dVar193;
                auVar446 = vfmadd231sd_fma(auVar435,auVar444,auVar441);
                auVar446 = vfmadd231sd_fma(auVar446,auVar206,local_188);
                if (append) {
                  pcVar125 = (this->ce).p._M_t.
                             super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                             super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar174][lVar173];
                  auVar121._8_8_ = 0;
                  auVar121._0_8_ = dVar185;
                  auVar438._8_8_ = 0;
                  auVar438._0_8_ = dVar193 * local_208;
                  auVar433 = vfmadd231sd_fma(auVar438,auVar444,auVar121);
                  auVar122._8_8_ = 0;
                  auVar122._0_8_ = local_1f8;
                  auVar433 = vfmadd231sd_fma(auVar433,local_188,auVar122);
                  auVar446 = vunpcklpd_avx(auVar446,auVar433);
                  pdVar2 = (double *)((long)&pcVar125->ex + lVar172);
                  dVar194 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar125->ex + lVar172);
                  *pdVar3 = auVar446._0_8_ + *pdVar2;
                  pdVar3[1] = auVar446._8_8_ + dVar194;
                  auVar426._8_8_ = 0;
                  auVar426._0_8_ = local_330 * dVar193;
                  auVar446 = vfmadd231sd_fma(auVar426,auVar178,auVar444);
                  auVar446 = vfmadd231sd_fma(auVar446,local_188,auVar205);
                  *(double *)((long)&pcVar125->ez + lVar172) =
                       auVar446._0_8_ + *(double *)((long)&pcVar125->ez + lVar172);
                  auVar427._0_8_ = local_298 * dVar197;
                  auVar427._8_8_ = auVar179._8_8_ * dVar197;
                  pcVar126 = (this->cb).p._M_t.
                             super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                             super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar174][lVar173];
                  auVar436._8_8_ = auVar180._0_8_;
                  auVar436._0_8_ = auVar180._0_8_;
                  auVar446 = vfmadd132pd_fma(auVar436,auVar427,auVar177);
                  auVar428._8_8_ = auVar181._0_8_;
                  auVar428._0_8_ = auVar181._0_8_;
                  auVar446 = vfmadd213pd_fma(auVar428,auVar206,auVar446);
                  pdVar2 = (double *)((long)&pcVar126->bx + lVar172);
                  auVar429._0_8_ = auVar446._0_8_ + *pdVar2;
                  auVar429._8_8_ = auVar446._8_8_ + pdVar2[1];
                  *(undefined1 (*) [16])((long)&pcVar126->bx + lVar172) = auVar429;
                  auVar417._8_8_ = 0;
                  auVar417._0_8_ = local_330 * dVar197;
                  auVar446 = vfmadd231sd_fma(auVar417,auVar178,auVar180);
                  auVar446 = vfmadd231sd_fma(auVar446,auVar205,auVar181);
                  *(double *)((long)&pcVar126->bz + lVar172) =
                       auVar446._0_8_ + *(double *)((long)&pcVar126->bz + lVar172);
                }
                else {
                  pcVar125 = (this->ce).p._M_t.
                             super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                             super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar174][lVar173];
                  *(long *)((long)&pcVar125->ex + lVar172) = auVar446._0_8_;
                  auVar437._8_8_ = 0;
                  auVar437._0_8_ = local_208 * dVar193;
                  auVar446 = vfmadd231sd_fma(auVar437,auVar444,auVar442);
                  auVar446 = vfmadd231sd_fma(auVar446,local_188,auVar135);
                  *(long *)((long)&pcVar125->ey + lVar172) = auVar446._0_8_;
                  auVar430._8_8_ = 0;
                  auVar430._0_8_ = local_330 * dVar193;
                  auVar446 = vfmadd231sd_fma(auVar430,auVar178,auVar444);
                  auVar446 = vfmadd231sd_fma(auVar446,local_188,auVar205);
                  *(long *)((long)&pcVar125->ez + lVar172) = auVar446._0_8_;
                  auVar431._8_8_ = 0;
                  auVar431._0_8_ = local_298 * dVar197;
                  auVar446 = vfmadd231sd_fma(auVar431,auVar180,auVar441);
                  auVar446 = vfmadd231sd_fma(auVar446,auVar181,auVar206);
                  pcVar126 = (this->cb).p._M_t.
                             super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                             super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                             super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar174][lVar173];
                  *(long *)((long)&pcVar126->bx + lVar172) = auVar446._0_8_;
                  auVar432._8_8_ = 0;
                  auVar432._0_8_ = local_208 * dVar197;
                  auVar446 = vfmadd231sd_fma(auVar432,auVar180,auVar442);
                  auVar446 = vfmadd231sd_fma(auVar446,auVar181,auVar135);
                  *(long *)((long)&pcVar126->by + lVar172) = auVar446._0_8_;
                  auVar418._8_8_ = 0;
                  auVar418._0_8_ = local_330 * dVar197;
                  auVar446 = vfmadd231sd_fma(auVar418,auVar178,auVar180);
                  auVar446 = vfmadd231sd_fma(auVar446,auVar205,auVar181);
                  *(long *)((long)&pcVar126->bz + lVar172) = auVar446._0_8_;
                }
              }
              lVar175 = lVar175 + 1;
              lVar172 = lVar172 + 0x18;
            } while (lVar175 < this->nz);
          }
          lVar173 = lVar173 + 1;
        } while (lVar173 < this->ny);
      }
      lVar174 = lVar174 + 1;
    } while (lVar174 < this->nx);
  }
  return;
}

Assistant:

void spatial_region::f_init_focused(double a0y, double a0z, double xsigma, double sigma0, double x0, double x1, bool b_sign, double phase, double y0, double z0, bool append, double phi, int sscos, double K, double xtarget, double ytarget, double ztarget)
{
    /* sigma0 - поперечный размер в перетяжке (импульс
     * аксиально-симметричный), x0 - положение центра лазерного
     * импульса, x1 - координата по x центра лазерного импульса
     * относительно центра перетяжки */
    /* y0, z0 - смещение центра импульса от оси области,
     * обеспечивающее нужный угол падения. Поворот импульса
     * производится так, что ey остаётся лежать в плоскости xy */
    /* ey задаётся симметричным (если бы импульс был плоским), ez -
     * антисимметричным (по продольной координате) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs и s (половина поперечного размера) */
    // K is a wavevector, K = 1 for first harmonic and 2 for the second.
    double sign = (x1<=0)-(x1>0);
    x1 = sqrt(x1*x1+y0*y0+z0*z0);
    if (x1==0) x1 = dx; // иначе не определён угол поворота импульса
    double xR = K * sigma0*sigma0/2;
    double sigma = sigma0*sqrt(1+x1*x1/xR/xR); // в начальном положении
    // ratio of first and second harmonics beam sizes at initial position
    double a_multiplier = sqrt(1 + x1 * x1 / (sigma0 * sigma0 * sigma0 * sigma0 / 4)) / sqrt(1 + x1 * x1 / (xR * xR));
    double xs = xsigma*2*sqrt(2*PI)/3;
    if ( sscos == 1 )
        xs = 0.822*xsigma;
    double s = sigma/2/sqrt(((double)3)/16-1/PI/PI);
    double s0 = sigma0/2/sqrt(((double)3)/16-1/PI/PI);
    double y12,z12;
    y12 = ny*dy/2;
    z12 = nz*dz/2;
    double r0x,r0y,r0z;
    r0x = sign*sqrt(x1*x1-y0*y0-z0*z0);
    r0x = r0x/x1;
    r0y = -y0/x1;
    r0z = -z0/x1;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double xi,x,r,cosx,cosr,sinx,sinr;
    double slocal,alocal;
    double ex,ey,ez,bx,by,bz;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                r = sqrt( (i*dx-x0-xtarget)*(i*dx-x0-xtarget) + (j*dy-y12-y0-ytarget)*(j*dy-y12-y0-ytarget) + (k*dz-z12-z0-ztarget)*(k*dz-z12-z0-ztarget) - x*x );
                xi = x + r*r/2*(x-x1)/((x-x1)*(x-x1)+xR*xR) - atan((x-x1)/xR) - atan(x1/xR);
                slocal = s0*sqrt( 1 + (xi-x1+atan(x1/xR))*(xi-x1+atan(x1/xR))/(xR*xR) );
                alocal = s/slocal * a_multiplier;
                if ( xi>-xs && xi<xs && r<slocal )
                {
                    if ( sscos == 1 ) {
                        cosx = cos(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - 4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + 4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*( K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) - alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) + alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else if (-2 * s0 * (x1 - x) / xR <= r && r <= 2 * s0 * (x1 - x) / xR) { // otherwise unphysical wings arise
                        cosx = cos(PI*xi/2/xs);
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi/2/xs);
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - PI/xs*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + PI/xs*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) - alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) + alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else {
                        ex = 0;
                        ey = 0;
                        ez = 0;
                        bx = 0;
                        by = 0;
                        bz = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}